

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlCtxtDumpString(xmlDebugCtxtPtr ctxt,xmlChar *str)

{
  byte bVar1;
  FILE *pFVar2;
  uint __c;
  char *__ptr;
  long lVar3;
  size_t sStack_30;
  
  if (ctxt->check != 0) {
    return;
  }
  if (str == (xmlChar *)0x0) {
    pFVar2 = (FILE *)ctxt->output;
    __ptr = "(NULL)";
    sStack_30 = 6;
  }
  else {
    for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 1) {
      bVar1 = str[lVar3];
      if (bVar1 == 0x20) {
LAB_0015fced:
        pFVar2 = (FILE *)ctxt->output;
        __c = 0x20;
LAB_0015fcf2:
        fputc(__c,pFVar2);
      }
      else {
        __c = (uint)bVar1;
        if (bVar1 == 0) {
          return;
        }
        if (((byte)(bVar1 - 9) < 2) || (__c == 0xd)) goto LAB_0015fced;
        pFVar2 = (FILE *)ctxt->output;
        if (-1 < (char)bVar1) goto LAB_0015fcf2;
        fprintf(pFVar2,"#%X");
      }
    }
    pFVar2 = (FILE *)ctxt->output;
    __ptr = "...";
    sStack_30 = 3;
  }
  fwrite(__ptr,sStack_30,1,pFVar2);
  return;
}

Assistant:

static void
xmlCtxtDumpString(xmlDebugCtxtPtr ctxt, const xmlChar * str)
{
    int i;

    if (ctxt->check) {
        return;
    }
    /* TODO: check UTF8 content of the string */
    if (str == NULL) {
        fprintf(ctxt->output, "(NULL)");
        return;
    }
    for (i = 0; i < 40; i++)
        if (str[i] == 0)
            return;
        else if (IS_BLANK_CH(str[i]))
            fputc(' ', ctxt->output);
        else if (str[i] >= 0x80)
            fprintf(ctxt->output, "#%X", str[i]);
        else
            fputc(str[i], ctxt->output);
    fprintf(ctxt->output, "...");
}